

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.cpp
# Opt level: O1

void __thiscall RayTracer::run(RayTracer *this,Scene *scene)

{
  int iVar1;
  int iVar2;
  Camera *this_00;
  long *plVar3;
  int x;
  int y;
  Vector3 dir;
  Color color;
  string local_88;
  Vector3 local_68;
  Color local_48;
  
  this->m_scene = scene;
  this_00 = scene->m_camera;
  iVar1 = this_00->m_w;
  if (0 < iVar1) {
    iVar2 = this_00->m_h;
    x = 0;
    do {
      if (0 < iVar2) {
        y = 0;
        do {
          if (y == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"column ",7);
            plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,x);
            std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
            std::ostream::put((char)plVar3);
            std::ostream::flush();
          }
          Camera::emit((Vector3 *)&local_88,this_00,x,y);
          local_68.z = (this_00->m_eye).z;
          local_68.x = (this_00->m_eye).x;
          local_68.y = (this_00->m_eye).y;
          m_rayTraceing(&local_48,this,&local_68,(Vector3 *)&local_88,1.0,1);
          Camera::setColor(this_00,x,y,&local_48);
          y = y + 1;
        } while (iVar2 != y);
      }
      x = x + 1;
    } while (x != iVar1);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"output.bmp","");
  Camera::print(this_00,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RayTracer::run(Scene* scene)
{
    m_scene = scene;
    Camera* camera = scene->getCamera();
    int w = camera->getW(), h = camera->getH();

    for (int i = 0; i < w; i++)
        for (int j = 0; j < h; j++)
        {
            if (!j) cout << "column " << i << endl;
            Vector3 dir = camera->emit(i, j);
            Color color = m_rayTraceing(camera->getEye(), dir, 1, 1);
            camera->setColor(i, j, color);
        }

    camera->print("output.bmp");
}